

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O3

int main(int argc,char **argv)

{
  void *pvVar1;
  size_t size;
  flatcc_builder_t builder;
  size_t local_1b0;
  flatcc_builder_t local_1a8;
  
  flatcc_builder_init(&local_1a8);
  create_monster_bottom_up(&local_1a8,0);
  pvVar1 = flatcc_builder_finalize_aligned_buffer(&local_1a8,&local_1b0);
  flatcc_builder_aligned_free(pvVar1);
  flatcc_builder_reset(&local_1a8);
  create_monster_bottom_up(&local_1a8,1);
  pvVar1 = flatcc_builder_finalize_aligned_buffer(&local_1a8,&local_1b0);
  access_monster_buffer(pvVar1);
  flatcc_builder_aligned_free(pvVar1);
  flatcc_builder_reset(&local_1a8);
  create_monster_top_down(&local_1a8);
  pvVar1 = flatcc_builder_finalize_buffer(&local_1a8,&local_1b0);
  access_monster_buffer(pvVar1);
  flatcc_builder_free(pvVar1);
  flatcc_builder_clear(&local_1a8);
  puts("The FlatBuffer was successfully created and accessed!");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // Create a `FlatBufferBuilder`, which will be used to create our
    // monsters' FlatBuffers.
    flatcc_builder_t builder;
    void  *buf;
    size_t size;

    // Silence warnings.
    (void)argc;
    (void)argv;

    // Initialize the builder object.
    flatcc_builder_init(&builder);
    test_assert(0 == create_monster_bottom_up(&builder, 0));

    // Allocate and extract a readable buffer from internal builder heap.
    // NOTE: Finalizing the buffer does NOT change the builder, it
    // just creates a snapshot of the builder content.
    // NOTE2: finalize_buffer uses malloc while finalize_aligned_buffer
    // uses a portable aligned allocation method. Often the malloc
    // version is sufficient, but won't work for all schema on all
    // systems. If the buffer is written to disk or network, but not
    // accessed in memory, `finalize_buffer` is also sufficient.
    // The flatcc_builder version of free or aligned_free should be used
    // instead of `free` although free will often work on POSIX systems.
    // This ensures portability and prevents issues when linking to
    // allocation libraries other than malloc.
    buf = flatcc_builder_finalize_aligned_buffer(&builder, &size);
    //buf = flatcc_builder_finalize_buffer(&builder, &size);

    // We now have a FlatBuffer we can store on disk or send over a network.
    // ** file/network code goes here :) **
    // Instead, we're going to access it right away (as if we just received it).
    //access_monster_buffer(buf);

    // prior to v0.5.0, use `aligned_free`
    flatcc_builder_aligned_free(buf);
    //free(buf);
    //
    // The builder object can optionally be reused after a reset which
    // is faster than creating a new builder. Subsequent use might
    // entirely avoid temporary allocations until finalizing the buffer.
    flatcc_builder_reset(&builder);
    test_assert(0 == create_monster_bottom_up(&builder, 1));
    buf = flatcc_builder_finalize_aligned_buffer(&builder, &size);
    access_monster_buffer(buf);
    flatcc_builder_aligned_free(buf);
    flatcc_builder_reset(&builder);
    create_monster_top_down(&builder);
    buf = flatcc_builder_finalize_buffer(&builder, &size);
    test_assert(0 == access_monster_buffer(buf));
    flatcc_builder_free(buf);
    // Eventually the builder must be cleaned up:
    flatcc_builder_clear(&builder);

    printf("The FlatBuffer was successfully created and accessed!\n");

    return 0;
}